

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall
QItemSelectionModelPrivate::layoutChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_1,
          LayoutChangeHint hint)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QPersistentModelIndex *this_01;
  QItemSelection *this_02;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this_03;
  QList<QPersistentModelIndex> *this_04;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this_05;
  QList<QPersistentModelIndex> *this_06;
  int iVar1;
  QAbstractItemModel *pQVar2;
  undefined8 uVar3;
  quintptr qVar4;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  long lVar9;
  iterator iVar10;
  iterator iVar11;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tableSelected == true) {
    iVar1 = this->tableColCount;
    this_00 = &this->model;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
    this_01 = &this->tableParent;
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
    iVar6 = (*(pQVar2->super_QObject)._vptr_QObject[0x10])(pQVar2,&local_58);
    if (iVar1 == iVar6) {
      iVar1 = this->tableRowCount;
      QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
      ::value(this_00);
      pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
      QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
      iVar6 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,&local_78);
      if (iVar1 == iVar6) {
        QList<QItemSelectionRange>::clear(&(this->ranges).super_QList<QItemSelectionRange>);
        this_02 = &this->currentSelection;
        QList<QItemSelectionRange>::clear(&this_02->super_QList<QItemSelectionRange>);
        iVar1 = this->tableColCount;
        iVar6 = this->tableRowCount;
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])(&local_58,pQVar2,0,0,&local_78);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar2,(ulong)(iVar6 - 1),(ulong)(iVar1 - 1),&local_90);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_90,&local_58,&local_78);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)this_02,
                   (this->currentSelection).super_QList<QItemSelectionRange>.d.size,
                   (QItemSelectionRange *)&local_90);
        QList<QItemSelectionRange>::end(&this_02->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_90.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_90);
        local_90.r = -1;
        local_90.c = -1;
        local_90.i = 0;
        local_90.m.ptr = (QAbstractItemModel *)0x0;
        QPersistentModelIndex::operator=(this_01,&local_90);
        this->tableSelected = false;
        goto LAB_0046bb57;
      }
    }
  }
  if (hint == VerticalSortHint) {
LAB_0046b658:
    if (((this->savedPersistentRowLengths).d.size == 0) &&
       ((this->savedPersistentCurrentRowLengths).d.size == 0)) goto LAB_0046bb57;
  }
  else {
    if (((this->savedPersistentCurrentIndexes).d.size == 0) &&
       ((this->savedPersistentIndexes).d.size == 0)) goto LAB_0046bb57;
    if (hint == VerticalSortHint) goto LAB_0046b658;
  }
  QList<QItemSelectionRange>::clear(&(this->ranges).super_QList<QItemSelectionRange>);
  QList<QItemSelectionRange>::clear(&(this->currentSelection).super_QList<QItemSelectionRange>);
  if (hint == VerticalSortHint) {
    this_03 = &this->savedPersistentRowLengths;
    iVar7 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin(this_03);
    iVar8 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end(this_03);
    if (iVar7.i != iVar8.i) {
      lVar9 = (long)iVar8.i - (long)iVar7.i >> 4;
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      std::
      _Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
      ::_Temporary_buffer((_Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
                           *)&local_58,iVar7,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
        std::
        __inplace_stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar7.i,iVar8.i);
      }
      else {
        std::
        __stable_sort_adaptive<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,std::pair<QPersistentModelIndex,unsigned_int>*,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar7.i,iVar8.i,local_58.m.ptr,local_58.i);
      }
      std::
      _Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
                  *)&local_58);
    }
    this_05 = &this->savedPersistentCurrentRowLengths;
    iVar7 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin(this_05);
    iVar8 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end(this_05);
    if (iVar7.i != iVar8.i) {
      lVar9 = (long)iVar8.i - (long)iVar7.i >> 4;
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      std::
      _Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
      ::_Temporary_buffer((_Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
                           *)&local_58,iVar7,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
        std::
        __inplace_stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar7.i,iVar8.i);
      }
      else {
        std::
        __stable_sort_adaptive<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,std::pair<QPersistentModelIndex,unsigned_int>*,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar7.i,iVar8.i,local_58.m.ptr,local_58.i);
      }
      std::
      _Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::iterator,_std::pair<QPersistentModelIndex,_unsigned_int>_>
                  *)&local_58);
    }
    mergeRowLengths((QItemSelection *)&local_78,this_03);
    tVar5.ptr = local_78.m.ptr;
    qVar4 = local_78.i;
    uVar3 = local_78._0_8_;
    local_78._0_8_ = (Data *)0x0;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
    local_58._0_8_ = (this->ranges).super_QList<QItemSelectionRange>.d.d;
    local_58.i = (quintptr)(this->ranges).super_QList<QItemSelectionRange>.d.ptr;
    (this->ranges).super_QList<QItemSelectionRange>.d.d = (Data *)uVar3;
    (this->ranges).super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)qVar4;
    local_58.m.ptr = (QAbstractItemModel *)(this->ranges).super_QList<QItemSelectionRange>.d.size;
    (this->ranges).super_QList<QItemSelectionRange>.d.size = (qsizetype)tVar5.ptr;
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
    mergeRowLengths((QItemSelection *)&local_78,this_05);
    tVar5.ptr = local_78.m.ptr;
    qVar4 = local_78.i;
    uVar3 = local_78._0_8_;
    local_78._0_8_ = (Data *)0x0;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
    local_58._0_8_ = (this->currentSelection).super_QList<QItemSelectionRange>.d.d;
    local_58.i = (quintptr)(this->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.d = (Data *)uVar3;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)qVar4;
    local_58.m.ptr =
         (QAbstractItemModel *)(this->currentSelection).super_QList<QItemSelectionRange>.d.size;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.size = (qsizetype)tVar5.ptr;
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(this_03);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(this_05);
  }
  else {
    this_04 = &this->savedPersistentIndexes;
    iVar10 = QList<QPersistentModelIndex>::begin(this_04);
    iVar11 = QList<QPersistentModelIndex>::end(this_04);
    if (iVar10.i != iVar11.i) {
      lVar9 = (long)iVar11.i - (long)iVar10.i >> 3;
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      std::_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>::
      _Temporary_buffer((_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>
                         *)&local_58,iVar10,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
        std::
        __inplace_stable_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
                  (iVar10,iVar11,
                   (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                    )0x46c5df);
      }
      else {
        std::
        __stable_sort_adaptive<QList<QPersistentModelIndex>::iterator,QPersistentModelIndex*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
                  (iVar10,iVar11,(QPersistentModelIndex *)local_58.m.ptr,local_58.i,
                   (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                    )0x46c5df);
      }
      std::_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>::
      ~_Temporary_buffer((_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>
                          *)&local_58);
    }
    this_06 = &this->savedPersistentCurrentIndexes;
    iVar10 = QList<QPersistentModelIndex>::begin(this_06);
    iVar11 = QList<QPersistentModelIndex>::end(this_06);
    if (iVar10.i != iVar11.i) {
      lVar9 = (long)iVar11.i - (long)iVar10.i >> 3;
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      std::_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>::
      _Temporary_buffer((_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>
                         *)&local_58,iVar10,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
        std::
        __inplace_stable_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
                  (iVar10,iVar11,
                   (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                    )0x46c5df);
      }
      else {
        std::
        __stable_sort_adaptive<QList<QPersistentModelIndex>::iterator,QPersistentModelIndex*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
                  (iVar10,iVar11,(QPersistentModelIndex *)local_58.m.ptr,local_58.i,
                   (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                    )0x46c5df);
      }
      std::_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>::
      ~_Temporary_buffer((_Temporary_buffer<QList<QPersistentModelIndex>::iterator,_QPersistentModelIndex>
                          *)&local_58);
    }
    mergeIndexes((QItemSelection *)&local_78,this_04);
    tVar5.ptr = local_78.m.ptr;
    qVar4 = local_78.i;
    uVar3 = local_78._0_8_;
    local_78._0_8_ = (Data *)0x0;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
    local_58._0_8_ = (this->ranges).super_QList<QItemSelectionRange>.d.d;
    local_58.i = (quintptr)(this->ranges).super_QList<QItemSelectionRange>.d.ptr;
    (this->ranges).super_QList<QItemSelectionRange>.d.d = (Data *)uVar3;
    (this->ranges).super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)qVar4;
    local_58.m.ptr = (QAbstractItemModel *)(this->ranges).super_QList<QItemSelectionRange>.d.size;
    (this->ranges).super_QList<QItemSelectionRange>.d.size = (qsizetype)tVar5.ptr;
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
    mergeIndexes((QItemSelection *)&local_78,this_06);
    tVar5.ptr = local_78.m.ptr;
    qVar4 = local_78.i;
    uVar3 = local_78._0_8_;
    local_78._0_8_ = (Data *)0x0;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
    local_58._0_8_ = (this->currentSelection).super_QList<QItemSelectionRange>.d.d;
    local_58.i = (quintptr)(this->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.d = (Data *)uVar3;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)qVar4;
    local_58.m.ptr =
         (QAbstractItemModel *)(this->currentSelection).super_QList<QItemSelectionRange>.d.size;
    (this->currentSelection).super_QList<QItemSelectionRange>.d.size = (qsizetype)tVar5.ptr;
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
    QList<QPersistentModelIndex>::clear(this_04);
    QList<QPersistentModelIndex>::clear(this_06);
  }
LAB_0046bb57:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::layoutChanged(const QList<QPersistentModelIndex> &, QAbstractItemModel::LayoutChangeHint hint)
{
    // special case for when all indexes are selected
    if (tableSelected && tableColCount == model->columnCount(tableParent)
        && tableRowCount == model->rowCount(tableParent)) {
        ranges.clear();
        currentSelection.clear();
        int bottom = tableRowCount - 1;
        int right = tableColCount - 1;
        QModelIndex tl = model->index(0, 0, tableParent);
        QModelIndex br = model->index(bottom, right, tableParent);
        currentSelection << QItemSelectionRange(tl, br);
        tableParent = QModelIndex();
        tableSelected = false;
        return;
    }

    if ((hint != QAbstractItemModel::VerticalSortHint && savedPersistentCurrentIndexes.isEmpty() && savedPersistentIndexes.isEmpty())
     || (hint == QAbstractItemModel::VerticalSortHint && savedPersistentRowLengths.isEmpty() && savedPersistentCurrentRowLengths.isEmpty())) {
        // either the selection was actually empty, or we
        // didn't get the layoutAboutToBeChanged() signal
        return;
    }

    // clear the "old" selection
    ranges.clear();
    currentSelection.clear();

    if (hint != QAbstractItemModel::VerticalSortHint) {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentIndexes.begin(), savedPersistentIndexes.end(),
                         qt_PersistentModelIndexLessThan);
        std::stable_sort(savedPersistentCurrentIndexes.begin(), savedPersistentCurrentIndexes.end(),
                         qt_PersistentModelIndexLessThan);

        // update the selection by merging the individual indexes
        ranges = mergeIndexes(savedPersistentIndexes);
        currentSelection = mergeIndexes(savedPersistentCurrentIndexes);

        // release the persistent indexes
        savedPersistentIndexes.clear();
        savedPersistentCurrentIndexes.clear();
    } else {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentRowLengths.begin(), savedPersistentRowLengths.end());
        std::stable_sort(savedPersistentCurrentRowLengths.begin(), savedPersistentCurrentRowLengths.end());

        // update the selection by merging the individual indexes
        ranges = mergeRowLengths(savedPersistentRowLengths);
        currentSelection = mergeRowLengths(savedPersistentCurrentRowLengths);

        // release the persistent indexes
        savedPersistentRowLengths.clear();
        savedPersistentCurrentRowLengths.clear();
    }
}